

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

Format * __thiscall
google::protobuf::io::Printer::TokenizeFormat
          (Format *__return_storage_ptr__,Printer *this,string_view format_string,
          PrintOptions *options)

{
  size_t sVar1;
  undefined2 uVar2;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  pointer pCVar3;
  pointer pLVar4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  size_t sVar11;
  char *pcVar12;
  basic_string_view<char,_std::char_traits<char>_> bVar13;
  bool bVar14;
  bool bVar15;
  size_type sVar16;
  pointer pCVar17;
  undefined8 extraout_RDX;
  undefined8 uVar18;
  undefined8 extraout_RDX_00;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  string_view sVar22;
  string_view str;
  string_view prefix;
  string_view expected;
  string_view prefix_00;
  string_view expected_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  PrintOptions opts;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  pointer local_180;
  Format *local_178;
  Printer *local_170;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  pointer local_150;
  ulong local_148;
  PrintOptions *local_140;
  string_view orig;
  size_t local_128;
  char *pcStack_120;
  Chunk local_108;
  const_iterator __begin3;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c0;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  const_iterator __end3;
  const_iterator __end2;
  
  pCVar17 = (pointer)format_string._M_str;
  local_198._M_len = format_string._M_len;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->lines).
           super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->lines).
           super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->lines).
  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->lines).
  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178 = __return_storage_ptr__;
  local_170 = this;
  local_140 = options;
  if (options->strip_raw_string_indentation == true) {
    local_180 = (pointer)0x0;
    sVar19 = 0;
    uVar20 = 0;
    sVar22 = format_string;
    orig._M_len = local_198._M_len;
    orig._M_str = (char *)pCVar17;
    while (local_198 = sVar22, sVar22._M_str = (char *)pCVar17, sVar22._M_len = (size_t)"\n",
          bVar14 = absl::lts_20250127::ConsumePrefix
                             ((lts_20250127 *)&local_198,(Nonnull<absl::string_view_*>)0x1,sVar22),
          __return_storage_ptr__ = local_178, bVar14) {
      prefix._M_str = "#";
      prefix._M_len = 1;
      pCVar17 = (pointer)0xf01c74;
      bVar14 = absl::lts_20250127::StartsWith(local_198,prefix);
      if (bVar14) {
        if (sVar19 == 0) {
          local_180 = (pointer)local_198._M_str;
          sVar19 = local_198._M_len;
        }
        sVar16 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_198,'\n',0);
        if (sVar16 == 0xffffffffffffffff) goto LAB_00c9a59f;
        sVar22 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_198,sVar16,0xffffffffffffffff);
      }
      else {
LAB_00c9a59f:
        local_178->is_raw_string = true;
        uVar20 = 0xffffffffffffffff;
        do {
          expected._M_str = (char *)pCVar17;
          expected._M_len = (size_t)" ";
          bVar14 = absl::lts_20250127::ConsumePrefix
                             ((lts_20250127 *)&local_198,(Nonnull<absl::string_view_*>)0x1,expected)
          ;
          uVar20 = uVar20 + 1;
          sVar22 = local_198;
        } while (bVar14);
      }
    }
    if (sVar19 == 0) {
      if (local_198._M_len == 0) {
        local_198._M_str = orig._M_str;
        local_198._M_len = orig._M_len;
        local_178->is_raw_string = false;
        uVar20 = 0;
      }
    }
    else {
      local_198._M_str = (char *)local_180;
      local_198._M_len = sVar19;
    }
    if ((local_170->at_start_of_line_ == false) &&
       (prefix_00._M_str = "#", prefix_00._M_len = 1,
       bVar14 = absl::lts_20250127::StartsWith(local_198,prefix_00), bVar14)) {
      local_198._M_str = orig._M_str;
      local_198._M_len = orig._M_len;
    }
    pCVar17 = (pointer)local_198._M_str;
    bVar13 = local_198;
  }
  else {
    uVar20 = 0;
    bVar13 = format_string;
  }
  local_198 = bVar13;
  local_a8.delimiter_.c_ = '\n';
  local_a8.text_._M_len = local_198._M_len;
  local_a8.text_._M_str = (char *)pCVar17;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin((const_iterator *)&orig,&local_a8);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::end(&__end2,&local_a8);
  bVar14 = true;
  local_148 = uVar20;
  do {
    if (((State)orig._M_str == __end2.state_) && (orig._M_len == __end2.pos_)) {
      if (__return_storage_ptr__->is_raw_string == true) {
        while ((pLVar4 = (__return_storage_ptr__->lines).
                         super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
               (__return_storage_ptr__->lines).
               super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
               ._M_impl.super__Vector_impl_data._M_start != pLVar4 &&
               (pLVar4[-1].chunks.
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                pLVar4[-1].chunks.
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_finish))) {
          std::
          vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
          ::pop_back(&__return_storage_ptr__->lines);
        }
      }
      return __return_storage_ptr__;
    }
    local_168._M_str = pcStack_120;
    local_168._M_len = local_128;
    if (__return_storage_ptr__->is_raw_string == false) {
LAB_00c9a706:
      uVar21 = 0;
      while (!bVar14) {
        expected_00._M_str = (char *)pCVar17;
        expected_00._M_len = (size_t)" ";
        bVar15 = absl::lts_20250127::ConsumePrefix
                           ((lts_20250127 *)&local_168,(Nonnull<absl::string_view_*>)0x1,expected_00
                           );
        if (!bVar15) goto LAB_00c9a72c;
        uVar21 = uVar21 + 1;
      }
      uVar21 = 0;
LAB_00c9a72c:
      std::
      vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
      ::emplace_back<>(&__return_storage_ptr__->lines);
      local_180 = (__return_storage_ptr__->lines).
                  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      sVar19 = 0;
      if (uVar20 <= uVar21) {
        sVar19 = uVar21 - uVar20;
      }
      local_180[-1].indent = sVar19;
      local_c0.delimiter_.c_ = (local_170->options_).variable_delimiter;
      local_c0.text_._M_len = local_168._M_len;
      local_c0.text_._M_str = local_168._M_str;
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::begin(&__begin3,&local_c0);
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::end(&__end3,&local_c0);
      local_150 = local_180 + -1;
      sVar19 = 0;
      bVar14 = false;
      uVar18 = extraout_RDX;
      while ((pcVar12 = __begin3.curr_._M_str, sVar11 = __begin3.curr_._M_len,
             __begin3.state_ != __end3.state_ || (__begin3.pos_ != __end3.pos_))) {
        pCVar17 = local_180[-1].chunks.
                  super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar15 = bVar14;
        if (local_180[-1].chunks.
            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_start == pCVar17) {
LAB_00c9a833:
          if (sVar11 != 0 || bVar15 != false) {
LAB_00c9a840:
            local_108.text._M_len = sVar11;
            local_108.text._M_str = pcVar12;
            local_108.is_var = bVar14;
            std::
            vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
            ::emplace_back<google::protobuf::io::Printer::Format::Chunk>
                      (&local_150->chunks,&local_108);
          }
          sVar1 = sVar11 + sVar19;
          sVar19 = sVar19 + sVar11 + 2;
          if (bVar15 == false) {
            sVar19 = sVar1;
          }
          bVar14 = (bool)(bVar14 ^ 1);
        }
        else {
          bVar15 = true;
          if (bVar14 != false) goto LAB_00c9a840;
          bVar13._M_len = pCVar17[-1].text._M_len;
          bVar13._M_str = pCVar17[-1].text._M_str;
          __y._M_str = "_start";
          __y._M_len = 6;
          bVar15 = std::operator==(bVar13,__y);
          if ((!bVar15) &&
             (__x._M_len = pCVar17[-1].text._M_len, __x._M_str = pCVar17[-1].text._M_str,
             __y_00._M_str = "_end", __y_00._M_len = 4, bVar15 = std::operator==(__x,__y_00),
             !bVar15)) {
            bVar15 = false;
            goto LAB_00c9a833;
          }
          pCVar17[-1].text._M_len = pCVar17[-1].text._M_len + sVar11 + 1;
          sVar19 = sVar19 + sVar11 + 1;
        }
        __return_storage_ptr__ = local_178;
        absl::lts_20250127::strings_internal::
        SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&__begin3);
        uVar18 = extraout_RDX_00;
      }
      uVar2 = local_140->loc;
      uVar5 = local_140->checks_are_debug_only;
      uVar6 = local_140->use_substitution_map;
      uVar7 = local_140->use_curly_brace_substitutions;
      uVar8 = local_140->allow_digit_substitutions;
      uVar9 = local_140->strip_spaces_around_vars;
      uVar10 = local_140->strip_raw_string_indentation;
      opts.strip_raw_string_indentation = (bool)uVar10;
      opts.strip_spaces_around_vars = (bool)uVar9;
      opts.allow_digit_substitutions = (bool)uVar8;
      opts.use_curly_brace_substitutions = (bool)uVar7;
      opts.use_substitution_map = (bool)uVar6;
      opts.checks_are_debug_only = (bool)uVar5;
      opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)uVar2;
      __begin3.pos_ = (size_t)local_150;
      message.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::io::Printer::TokenizeFormat(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions_const&)::__0,std::__cxx11::string>
      ;
      message.ptr_.obj = &__begin3;
      opts.use_annotation_frames = SUB81(uVar18,0);
      Validate(sVar19 == local_168._M_len,opts,message);
      pCVar3 = local_180[-1].chunks.
               super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar17 = local_180[-1].chunks.
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while (((uVar20 = local_148, pCVar17 != pCVar3 && (pCVar17[-1].is_var == false)) &&
             (pCVar17[-1].text._M_len == 0))) {
        pCVar17 = pCVar17 + -1;
        local_180[-1].chunks.
        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar17;
      }
    }
    else {
      pCVar17 = (pointer)(local_170->options_).ignored_comment_start._M_len;
      sVar16 = std::basic_string_view<char,_std::char_traits<char>_>::find
                         (&local_168,(local_170->options_).ignored_comment_start._M_str,0,
                          (size_type)pCVar17);
      if (sVar16 == 0xffffffffffffffff) goto LAB_00c9a706;
      local_168 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_168,0,sVar16)
      ;
      str._M_str = local_168._M_str;
      str._M_len = (size_t)str._M_str;
      sVar22 = absl::lts_20250127::StripLeadingAsciiWhitespace((lts_20250127 *)local_168._M_len,str)
      ;
      if (sVar22._M_len != 0) goto LAB_00c9a706;
    }
    bVar14 = false;
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&orig);
  } while( true );
}

Assistant:

Printer::Format Printer::TokenizeFormat(absl::string_view format_string,
                                        const PrintOptions& options) {
  Format format;
  size_t raw_string_indent = 0;
  if (options.strip_raw_string_indentation) {
    // We are processing a call that looks like
    //
    // p->Emit(R"cc(
    //   class Foo {
    //     int x, y, z;
    //   };
    // )cc");
    //
    // or
    //
    // p->Emit(R"cc(
    //
    //   class Foo {
    //     int x, y, z;
    //   };
    // )cc");
    //
    // To compute the indent, we need:
    //   1. Iterate over each line.
    //   2. Find the first line that contains non-whitespace characters.
    //   3. Count the number of leading spaces on that line.
    //
    // The following pairs of loops assume the current line is the first line
    // with non-whitespace characters; if we consume all the spaces and
    // then immediately hit a newline, this means this wasn't the right line and
    // we should start over.
    //
    // Note that the very first character *must* be a newline; that is how we
    // detect that this is a multi-line raw string template, and as such this is
    // a while loop, not a do/while loop.

    absl::string_view orig = format_string;
    absl::string_view first_pp_directive;
    while (absl::ConsumePrefix(&format_string, "\n")) {
      // clang-format will think a # at the beginning of the line in a raw
      // string is a preprocessor directive and put it at the start of the line,
      // which throws off indent calculation. Skip past those to find code that
      // is indented more realistically.
      if (absl::StartsWith(format_string, "#")) {
        // We don't want to drop the first #... lines. We just want to skip
        // through here. Remember to allow resetting later.
        if (first_pp_directive.empty()) {
          first_pp_directive = format_string;
        }
        size_t next_newline_index = format_string.find('\n');
        if (next_newline_index != absl::string_view::npos) {
          format_string = format_string.substr(next_newline_index);
          continue;
        }
      }
      raw_string_indent = 0;
      format.is_raw_string = true;
      while (absl::ConsumePrefix(&format_string, " ")) {
        ++raw_string_indent;
      }
    }
    // Reset if we skipped through some #... lines, so that we don't drop them.
    if (!first_pp_directive.empty()) {
      format_string = first_pp_directive;
    }

    // If we consume the entire string, this probably wasn't a raw string and
    // was probably something like a couple of explicit newlines.
    if (format_string.empty()) {
      format_string = orig;
      format.is_raw_string = false;
      raw_string_indent = 0;
    }

    // This means we have a preprocessor directive and we should not have eaten
    // the newline.
    if (!at_start_of_line_ && absl::StartsWith(format_string, "#")) {
      format_string = orig;
    }
  }

  // We now split the remaining format string into lines and discard:
  //   1. A trailing Printer-discarded comment, if this is a raw string.
  //
  //   2. All leading spaces to compute that line's indent.
  //      We do not do this for the first line, so that Emit("  ") works
  //      correctly. We do this *regardless* of whether we are processing
  //      a raw string, because existing non-raw-string calls to cpp::Formatter
  //      rely on this. There is a test that validates this behavior.
  //
  //   3. Set the indent for that line to max(0, line_indent -
  //      raw_string_indent), if this is not a raw string.
  //
  //   4. Trailing empty lines, if we know this is a raw string, except for
  //      a single extra newline at the end.
  //
  // Each line is itself split into chunks along the variable delimiters, e.g.
  // $...$.
  bool is_first = true;
  for (absl::string_view line_text : absl::StrSplit(format_string, '\n')) {
    if (format.is_raw_string) {
      size_t comment_index = line_text.find(options_.ignored_comment_start);
      if (comment_index != absl::string_view::npos) {
        line_text = line_text.substr(0, comment_index);
        if (absl::StripLeadingAsciiWhitespace(line_text).empty()) {
          // If the first line is part of an ignored comment, consider that a
          // first line as well.
          is_first = false;
          continue;
        }
      }
    }

    size_t line_indent = 0;
    while (!is_first && absl::ConsumePrefix(&line_text, " ")) {
      ++line_indent;
    }
    is_first = false;

    format.lines.emplace_back();
    auto& line = format.lines.back();
    line.indent =
        line_indent > raw_string_indent ? line_indent - raw_string_indent : 0;

    bool is_var = false;
    size_t total_len = 0;
    for (absl::string_view chunk :
         absl::StrSplit(line_text, options_.variable_delimiter)) {
      // The special _start and _end variables should actually glom the next
      // chunk into themselves, so as to be of the form _start$foo and _end$foo.
      if (!line.chunks.empty() && !is_var) {
        auto& prev = line.chunks.back();
        if (prev.text == "_start" || prev.text == "_end") {
          // The +1 below is to account for the $ in between them.
          // This string is safe, because prev.text and chunk are contiguous
          // by construction.
          prev.text = absl::string_view(prev.text.data(),
                                        prev.text.size() + 1 + chunk.size());

          // Account for the foo$ part of $_start$foo$.
          total_len += chunk.size() + 1;
          continue;
        }
      }

      if (is_var || !chunk.empty()) {
        line.chunks.push_back(Format::Chunk{chunk, is_var});
      }

      total_len += chunk.size();
      if (is_var) {
        // This accounts for the $s around a variable.
        total_len += 2;
      }

      is_var = !is_var;
    }

    // To ensure there are no unclosed $...$, we check that the computed length
    // above equals the actual length of the string. If it's off, that means
    // that there are missing or extra $ characters.
    Validate(total_len == line_text.size(), options, [&line] {
      if (line.chunks.empty()) {
        return std::string("wrong number of variable delimiters");
      }

      return absl::StrFormat("unclosed variable name: `%s`",
                             absl::CHexEscape(line.chunks.back().text));
    });

    // Trim any empty, non-variable chunks.
    while (!line.chunks.empty()) {
      auto& last = line.chunks.back();
      if (last.is_var || !last.text.empty()) {
        break;
      }

      line.chunks.pop_back();
    }
  }

  // Discard any trailing newlines (i.e., lines which contain no chunks.)
  if (format.is_raw_string) {
    while (!format.lines.empty() && format.lines.back().chunks.empty()) {
      format.lines.pop_back();
    }
  }

#if 0  // Use this to aid debugging tokenization.
  LOG(INFO) << "--- " << format.lines.size() << " lines";
  for (size_t i = 0; i < format.lines.size(); ++i) {
    const auto& line = format.lines[i];

    auto log_line = absl::StrFormat("[\" \" x %d]", line.indent);
    for (const auto& chunk : line.chunks) {
      absl::StrAppendFormat(&log_line, " %s\"%s\"", chunk.is_var ? "$" : "",
                            absl::CHexEscape(chunk.text));
    }
    LOG(INFO) << log_line;
  }
  LOG(INFO) << "---";
#endif

  return format;
}